

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O0

TestCaseGroup *
deqp::gles31::Functional::createAtomicOpGroup<deqp::gles31::Functional::ShaderAtomicXorCase>
          (Context *context,AtomicOperandType operandType,char *groupName)

{
  TestCaseGroup *name;
  Context *context_00;
  TestNode *pTVar1;
  TestContext *testCtx;
  char *pcVar2;
  TestNode *node;
  allocator<char> local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  string caseName;
  DataType type;
  Precision precision;
  int typeNdx;
  int precNdx;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  TestNode *local_28;
  TestCaseGroup *group;
  char *groupName_local;
  Context *pCStack_10;
  AtomicOperandType operandType_local;
  Context *context_local;
  
  group = (TestCaseGroup *)groupName;
  groupName_local._4_4_ = operandType;
  pCStack_10 = context;
  pTVar1 = (TestNode *)operator_new(0x70);
  testCtx = gles31::Context::getTestContext(pCStack_10);
  name = group;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Atomic ",&local_69);
  std::operator+(&local_48,&local_68,(char *)group);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar1,testCtx,(char *)name,pcVar2);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  local_28 = pTVar1;
  for (precision = PRECISION_LOWP; (int)precision < 3; precision = precision + PRECISION_MEDIUMP) {
    for (type = TYPE_INVALID; (int)type < 2; type = type + TYPE_FLOAT) {
      caseName.field_2._12_4_ = precision;
      caseName.field_2._8_4_ = (uint)((int)type < 1) * 4 + 0x1b;
      pcVar2 = glu::getPrecisionName(precision);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,pcVar2,&local_f1);
      std::operator+(&local_d0,&local_f0,"_");
      pcVar2 = glu::getDataTypeName(caseName.field_2._8_4_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                     &local_d0,pcVar2);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator(&local_f1);
      pTVar1 = local_28;
      node = (TestNode *)operator_new(200);
      context_00 = pCStack_10;
      pcVar2 = (char *)std::__cxx11::string::c_str();
      ShaderAtomicXorCase::ShaderAtomicXorCase
                ((ShaderAtomicXorCase *)node,context_00,pcVar2,groupName_local._4_4_,
                 caseName.field_2._8_4_,caseName.field_2._12_4_);
      tcu::TestNode::addChild(pTVar1,node);
      std::__cxx11::string::~string((string *)local_b0);
    }
  }
  return (TestCaseGroup *)local_28;
}

Assistant:

static tcu::TestCaseGroup* createAtomicOpGroup (Context& context, AtomicOperandType operandType, const char* groupName)
{
	tcu::TestCaseGroup *const group = new tcu::TestCaseGroup(context.getTestContext(), groupName, (string("Atomic ") + groupName).c_str());
	try
	{
		for (int precNdx = 0; precNdx < PRECISION_LAST; precNdx++)
		{
			for (int typeNdx = 0; typeNdx < 2; typeNdx++)
			{
				const Precision		precision		= Precision(precNdx);
				const DataType		type			= typeNdx > 0 ? TYPE_INT : TYPE_UINT;
				const string		caseName		= string(getPrecisionName(precision)) + "_" + getDataTypeName(type);

				group->addChild(new T(context, caseName.c_str(), operandType, type, precision));
			}
		}

		return group;
	}
	catch (...)
	{
		delete group;
		throw;
	}
}